

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall spirv_cross::Compiler::expression_is_lvalue(Compiler *this,uint32_t id)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  
  uVar1 = expression_type_id(this,id);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar1);
  return pSVar2->basetype - AccelerationStructure < 0xfffffffd;
}

Assistant:

bool Compiler::expression_is_lvalue(uint32_t id) const
{
	auto &type = expression_type(id);
	switch (type.basetype)
	{
	case SPIRType::SampledImage:
	case SPIRType::Image:
	case SPIRType::Sampler:
		return false;

	default:
		return true;
	}
}